

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O3

int thitu(int tlev,int dam,obj *obj,obj *ostack,monst *magr,char *name)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char knmbuf [256];
  char onmbuf [256];
  int local_250;
  int local_24c;
  monst *local_248;
  obj *local_240;
  char local_238 [256];
  char local_138 [264];
  
  local_250 = dam;
  local_248 = magr;
  local_240 = ostack;
  if (name == (char *)0x0) {
    if (obj == (obj *)0x0) {
      panic("thitu: name & obj both null?");
    }
    if (obj->quan < 2) {
      pcVar5 = mshot_xname(obj);
    }
    else {
      pcVar5 = doname(obj);
    }
    strcpy(local_138,pcVar5);
    pcVar5 = killer_xname(obj);
    name = local_238;
    strcpy(name,pcVar5);
    local_24c = 1;
    pcVar5 = local_138;
LAB_001f4665:
    bVar2 = obj_is_pname(obj);
    if (bVar2 == '\0') {
      if (obj->quan < 2) {
        pcVar5 = an(pcVar5);
      }
    }
    else {
      pcVar5 = the(pcVar5);
    }
    bVar7 = obj->otyp != 0x219;
    bVar1 = false;
  }
  else {
    iVar3 = strncasecmp(name,"the ",4);
    if ((iVar3 == 0) || (iVar3 = strncasecmp(name,"an ",3), iVar3 == 0)) {
LAB_001f45de:
      local_24c = 1;
    }
    else {
      iVar3 = strncasecmp(name,"a ",2);
      local_24c = 0;
      if (iVar3 == 0) goto LAB_001f45de;
    }
    pcVar5 = name;
    if (obj != (obj *)0x0) goto LAB_001f4665;
    pcVar5 = an(name);
    bVar1 = true;
    bVar7 = true;
  }
  uVar4 = mt_random();
  iVar3 = uVar4 % 0x14 + 1;
  if (iVar3 < u.uac + tlev) {
    if ((bVar1) ||
       (bVar2 = artifact_hit(local_248,&youmonst,obj,local_240,'\x01',&local_250,iVar3),
       bVar2 == '\0')) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f4728;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f471f;
LAB_001f47d7:
        if (flags.verbose == '\0') goto LAB_001f4803;
        pcVar6 = exclam(local_250);
        pline("You are hit by %s%s",pcVar5,pcVar6);
      }
      else {
LAB_001f471f:
        if (ublindf != (obj *)0x0) {
LAB_001f4728:
          if (ublindf->oartifact == '\x1d') goto LAB_001f47d7;
        }
LAB_001f4803:
        pline("You are hit!");
      }
      if (bVar1) goto LAB_001f4890;
    }
    if (((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xe0) &&
       (bVar2 = hates_silver(youmonst.data), bVar2 != '\0')) {
      uVar4 = mt_random();
      local_250 = uVar4 % 0x14 + local_250 + 1;
      pline("The silver sears your flesh!");
      exercise(4,'\0');
    }
LAB_001f4890:
    if (!bVar7) {
      if ((u.uprops[7].extrinsic != 0) || (((byte)youmonst.mintrinsics & 0x40) != 0)) {
        pline("It doesn\'t seem to hurt you.");
        return 1;
      }
      pline("It burns!");
    }
    if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
      local_250 = (local_250 - (local_250 + 1 >> 0x1f)) + 1 >> 1;
    }
    losehp(local_250,name,local_24c);
    exercise(0,'\0');
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f4751;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f474c;
  }
  else {
LAB_001f474c:
    if (ublindf == (obj *)0x0) goto LAB_001f479c;
LAB_001f4751:
    if (ublindf->oartifact != '\x1d') goto LAB_001f479c;
  }
  if (flags.verbose != '\0') {
    pline("You are almost hit by %s.",pcVar5);
    return 0;
  }
LAB_001f479c:
  pline("It misses.");
  return 0;
}

Assistant:

int thitu(int tlev, int dam,
	  struct obj *obj, struct obj *ostack, struct monst *magr,
	  const char *name)	/* if null, then format `obj' */
{
	const char *onm, *knm;
	boolean is_acid;
	int kprefix = KILLED_BY_AN;
	int dieroll;
	char onmbuf[BUFSZ], knmbuf[BUFSZ];

	if (!name) {
	    if (!obj) panic("thitu: name & obj both null?");
	    name = strcpy(onmbuf,
			 (obj->quan > 1L) ? doname(obj) : mshot_xname(obj));
	    knm = strcpy(knmbuf, killer_xname(obj));
	    kprefix = KILLED_BY;  /* killer_name supplies "an" if warranted */
	} else {
	    knm = name;
	    /* [perhaps ought to check for plural here to] */
	    if (!strncmpi(name, "the ", 4) ||
		    !strncmpi(name, "an ", 3) ||
		    !strncmpi(name, "a ", 2)) kprefix = KILLED_BY;
	}
	onm = (obj && obj_is_pname(obj)) ? the(name) :
			    (obj && obj->quan > 1L) ? name : an(name);
	is_acid = (obj && obj->otyp == ACID_VENOM);

	dieroll = rnd(20);
	if (u.uac + tlev <= dieroll) {
		if (Blind || !flags.verbose) pline("It misses.");
		else pline("You are almost hit by %s.", onm);
		return 0;
	} else {
		if (!obj || !artifact_hit(magr, &youmonst, obj, ostack, TRUE,
					  &dam, dieroll)) {
			if (Blind || !flags.verbose) pline("You are hit!");
			else pline("You are hit by %s%s", onm, exclam(dam));
		}

		if (obj && objects[obj->otyp].oc_material == SILVER
				&& hates_silver(youmonst.data)) {
			dam += rnd(20);
			pline("The silver sears your flesh!");
			exercise(A_CON, FALSE);
		}
		if (is_acid && Acid_resistance)
			pline("It doesn't seem to hurt you.");
		else {
			if (is_acid) pline("It burns!");
			if (Half_physical_damage) dam = (dam+1) / 2;
			losehp(dam, knm, kprefix);
			exercise(A_STR, FALSE);
		}
		return 1;
	}
}